

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O3

void __thiscall
jsoncons::
order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
::flatten_and_destroy
          (order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
           *this)

{
  pointer pkVar1;
  bool bVar2;
  value_type *this_00;
  pointer pkVar3;
  iterator __end0;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  temp;
  undefined1 auStack_38 [8];
  pointer local_30;
  pointer pbStack_28;
  pointer local_20;
  
  pkVar3 = (this->members_).
           super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pkVar1 = (this->members_).
           super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pkVar3 != pkVar1) {
    local_30 = (pointer)0x0;
    pbStack_28 = (pointer)0x0;
    local_20 = (pointer)0x0;
    this_00 = &pkVar3->value_;
    do {
      if ((byte)(((byte)(this_00->field_0).json_ref_ & 0xf) - 0xd) < 2) {
        bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
                          (this_00);
        if (!bVar2) {
          std::
          vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
          ::
          emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    ((vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                      *)&local_30,this_00);
        }
      }
      pkVar3 = (pointer)(this_00 + 1);
      this_00 = this_00 + 3;
    } while (pkVar3 != pkVar1);
    json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
    ::flatten_and_destroy
              ((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                *)auStack_38);
    std::
    vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
    ::~vector((vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
               *)&local_30);
  }
  return;
}

Assistant:

Comp(const key_value_container_type& members_)
                : members_(members_)
            {
            }